

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-item.c
# Opt level: O1

void borg_deinscribe(int i)

{
  ushort uVar1;
  long lVar2;
  keycode_t k;
  long lVar3;
  
  lVar3 = (long)i;
  if ((borg_items[lVar3].tval == '\x1c') && (sv_food_slime_mold == (uint)borg_items[lVar3].sval)) {
    return;
  }
  borg_keypress(0x7d);
  uVar1 = z_info->pack_size;
  if ((int)(uint)uVar1 <= i) {
    if ((int)(uVar1 + 0xb) <= i) {
      lVar3 = 0;
      do {
        if ((borg_items->curses[lVar3 + -0x26] != false) &&
           (**(char **)(borg_items->curses + lVar3 + -0x3a) == '{')) {
          borg_keypress(0x7c);
          break;
        }
        lVar3 = lVar3 + 0x388;
      } while ((ulong)(uint)uVar1 * 0x388 + 0x2a60 != lVar3);
      k = (i - (uint)z_info->pack_size) + 0x24;
      goto LAB_0023082d;
    }
    if ((ulong)uVar1 != 0) {
      lVar2 = 0;
      do {
        if ((borg_items->curses[lVar2 + -0x26] != false) &&
           (**(char **)(borg_items->curses + lVar2 + -0x3a) == '{')) {
          borg_keypress(0x2f);
          break;
        }
        lVar2 = lVar2 + 0x388;
      } while ((ulong)uVar1 * 0x388 - lVar2 != 0);
    }
    lVar3 = lVar3 - (ulong)z_info->pack_size;
  }
  k = (keycode_t)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[lVar3];
LAB_0023082d:
  borg_keypress(k);
  borg_keypress(0x79);
  borg_keypress(0x79);
  return;
}

Assistant:

void borg_deinscribe(int i)
{

    /* Ok to inscribe Slime Molds */
    if (borg_items[i].tval == TV_FOOD
        && borg_items[i].sval == sv_food_slime_mold)
        return;

    /* Label it */
    borg_keypress('}');

    /* Choose from inventory */
    if (i < INVEN_WIELD) {
        /* Choose the item */
        borg_keypress(all_letters_nohjkl[i]);
    }

    /* Choose from equipment */
    else {
        if (i < INVEN_FEET) {
            for (int j = 0; j < INVEN_WIELD; j++) {
                /* Go to equipment (if necessary) */
                if (borg_items[j].iqty && borg_items[j].note[0] == '{') {
                    borg_keypress('/');
                    break;
                }
            }
            /* Choose the item */
            borg_keypress(all_letters_nohjkl[i - INVEN_WIELD]);

        } 
        else {
            for (int j = 0; j <= INVEN_FEET; j++) {
                /* Go to quiver (if necessary) */
                if (borg_items[j].iqty && borg_items[j].note[0] == '{') {
                    borg_keypress('|');
                    break;
                }
            }
            /* Choose the item */
            borg_keypress('0' + (i - QUIVER_START));
        }
    }

    /* May ask for a confirmation */
    borg_keypress('y');
    borg_keypress('y');
}